

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test2::inspectProgram
          (GPUShaderFP64Test2 *this,GLuint program_id,GLint n_uniforms,
          uniformTypeDetails *uniform_type,GLint *out_buffer_size,
          uniformDetails *out_uniform_details,GLuint uniform_block_index)

{
  code *pcVar1;
  GLint GVar2;
  GLuint GVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *pTVar7;
  long lVar8;
  reference pvVar9;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar10;
  reference local_3d0;
  MessageBuilder local_3c8;
  string local_248 [32];
  stringstream local_228 [8];
  stringstream uniform_name_stream;
  ostream local_218;
  string local_a0 [8];
  string uniform_name_str;
  GLchar *uniform_name;
  GLenum type;
  GLsizei size;
  GLint offset;
  GLint matrix_stride;
  GLuint index;
  long local_58;
  Functions *gl;
  vector<char,_std::allocator<char>_> extracted_uniform_name;
  GLint array_stride;
  uniformDetails *out_uniform_details_local;
  GLint *out_buffer_size_local;
  uniformTypeDetails *uniform_type_local;
  GLint n_uniforms_local;
  GLuint program_id_local;
  GPUShaderFP64Test2 *this_local;
  
  extracted_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  uniform_type_local._0_4_ = n_uniforms;
  uniform_type_local._4_4_ = program_id;
  _n_uniforms_local = this;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&gl);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  local_58 = CONCAT44(extraout_var,iVar4);
  offset = 0;
  size = 0;
  type = 0;
  uniform_name._4_4_ = 0;
  uniform_name._0_4_ = 0;
  uniform_name_str.field_2._8_8_ = 0;
  std::__cxx11::string::string(local_a0);
  std::__cxx11::stringstream::stringstream(local_228);
  iVar4 = (**(code **)(local_58 + 0xb38))(uniform_type_local._4_4_,m_uniform_block_name);
  dVar5 = (**(code **)(local_58 + 0x800))();
  glu::checkError(dVar5,"GetUniformBlockIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xe16);
  if (iVar4 == -1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Unifom block is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0xe1a);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(local_58 + 0x760))(uniform_type_local._4_4_,iVar4,0x8a40,out_buffer_size);
  dVar5 = (**(code **)(local_58 + 0x800))();
  glu::checkError(dVar5,"GetActiveUniformBlockiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xe1f);
  if (*out_buffer_size == 0) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Unifom block size is 0",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0xe23);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::operator<<(&local_218,"uniform_array");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(local_a0,local_248);
  std::__cxx11::string::~string(local_248);
  uniform_name_str.field_2._8_8_ = std::__cxx11::string::c_str();
  (**(code **)(local_58 + 0xb40))
            (uniform_type_local._4_4_,1,(undefined1 *)((long)&uniform_name_str.field_2 + 8),&offset)
  ;
  dVar5 = (**(code **)(local_58 + 0x800))();
  glu::checkError(dVar5,"GetUniformIndices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xe2e);
  if (offset == -1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Unifom is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0xe32);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  lVar8 = std::__cxx11::string::length();
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&gl,lVar8 * 2);
  GVar3 = uniform_type_local._4_4_;
  GVar2 = offset;
  pcVar1 = *(code **)(local_58 + 0x750);
  iVar4 = std::__cxx11::string::length();
  pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)&gl,0);
  (*pcVar1)(GVar3,GVar2,iVar4 * 2,0,(long)&uniform_name + 4,&uniform_name,pvVar9);
  dVar5 = (**(code **)(local_58 + 0x800))();
  glu::checkError(dVar5,"GetActiveUniform",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xe3a);
  if (((GLint)uniform_type_local == uniform_name._4_4_) &&
     (uniform_type->m_type == (GLenum)uniform_name)) {
    (**(code **)(local_58 + 0x770))(uniform_type_local._4_4_,1,&offset,0x8a3b,&type);
    dVar5 = (**(code **)(local_58 + 0x800))();
    glu::checkError(dVar5,"GetActiveUniformsiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0xe48);
    if (type == 0xffffffff) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Unifom has invalid offset",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0xe4c);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    out_uniform_details->m_offset = type;
    (**(code **)(local_58 + 0x770))(uniform_type_local._4_4_,1,&offset,0x8a3d,&size);
    dVar5 = (**(code **)(local_58 + 0x800))();
    glu::checkError(dVar5,"GetActiveUniformsiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0xe53);
    if (size == -1) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Unifom has invalid matrix stride",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0xe57);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    out_uniform_details->m_matrix_stride = size;
    (**(code **)(local_58 + 0x770))
              (uniform_type_local._4_4_,1,&offset,0x8a3c,
               &extracted_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                field_0x14);
    dVar5 = (**(code **)(local_58 + 0x800))();
    glu::checkError(dVar5,"GetActiveUniformsiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0xe5e);
    if (size == -1) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Unifom has invalid matrix stride",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0xe62);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    out_uniform_details->m_array_stride =
         extracted_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
    std::__cxx11::stringstream::~stringstream(local_228);
    std::__cxx11::string::~string(local_a0);
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&gl);
    return;
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_3c8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_3c8,(char (*) [41])"Error. Invalid GetActiveUniform results.");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [8])0x2c6f543);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)((long)&uniform_name + 4));
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [12])0x2b48384);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&uniform_type_local);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [9])". Type: ");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(uint *)&uniform_name);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [12])0x2b48384);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&uniform_type->m_type);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [9])". Name: ");
  local_3d0 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)&gl,0);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_3d0);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3c8);
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Invalid GetActiveUniform results",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
             ,0xe43);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GPUShaderFP64Test2::inspectProgram(glw::GLuint program_id, glw::GLint n_uniforms,
										const uniformTypeDetails& uniform_type, glw::GLint& out_buffer_size,
										uniformDetails& out_uniform_details, glw::GLuint uniform_block_index) const
{
	glw::GLint				 array_stride = 0;
	std::vector<glw::GLchar> extracted_uniform_name;
	const glw::Functions&	gl			   = m_context.getRenderContext().getFunctions();
	glw::GLuint				 index		   = 0;
	glw::GLint				 matrix_stride = 0;
	glw::GLint				 offset		   = 0;
	glw::GLsizei			 size		   = 0;
	glw::GLenum				 type		   = 0;
	const glw::GLchar*		 uniform_name  = 0;
	std::string				 uniform_name_str;
	std::stringstream		 uniform_name_stream;

	/* Get index of uniform block */
	uniform_block_index = gl.getUniformBlockIndex(program_id, m_uniform_block_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformBlockIndex");

	if (GL_INVALID_INDEX == uniform_block_index)
	{
		TCU_FAIL("Unifom block is inactive");
	}

	/* Get size of uniform block */
	gl.getActiveUniformBlockiv(program_id, uniform_block_index, GL_UNIFORM_BLOCK_DATA_SIZE, &out_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformBlockiv");

	if (0 == out_buffer_size)
	{
		TCU_FAIL("Unifom block size is 0");
	}

	/* Prepare uniform name */
	uniform_name_stream << "uniform_array";

	uniform_name_str = uniform_name_stream.str();
	uniform_name	 = uniform_name_str.c_str();

	/* Get index of uniform */
	gl.getUniformIndices(program_id, 1 /* count */, &uniform_name, &index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformIndices");

	if (GL_INVALID_INDEX == index)
	{
		TCU_FAIL("Unifom is inactive");
	}

	/* Verify getActiveUniform results */
	extracted_uniform_name.resize(uniform_name_str.length() * 2);

	gl.getActiveUniform(program_id, index, (glw::GLsizei)(uniform_name_str.length() * 2) /* bufSize */, 0, &size, &type,
						&extracted_uniform_name[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniform");

	if ((n_uniforms != size) || (uniform_type.m_type != type))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid GetActiveUniform results."
											<< " Size: " << size << " expected: " << n_uniforms << ". Type: " << type
											<< " expected: " << uniform_type.m_type
											<< ". Name: " << &extracted_uniform_name[0] << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid GetActiveUniform results");
	}

	/* Get offset of uniform */
	gl.getActiveUniformsiv(program_id, 1 /* count */, &index, GL_UNIFORM_OFFSET, &offset);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

	if (-1 == offset)
	{
		TCU_FAIL("Unifom has invalid offset");
	}

	out_uniform_details.m_offset = offset;

	/* Get matrix stride of uniform */
	gl.getActiveUniformsiv(program_id, 1 /* count */, &index, GL_UNIFORM_MATRIX_STRIDE, &matrix_stride);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

	if (-1 == matrix_stride)
	{
		TCU_FAIL("Unifom has invalid matrix stride");
	}

	out_uniform_details.m_matrix_stride = matrix_stride;

	/* Get array stride of uniform */
	gl.getActiveUniformsiv(program_id, 1 /* count */, &index, GL_UNIFORM_ARRAY_STRIDE, &array_stride);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

	if (-1 == matrix_stride)
	{
		TCU_FAIL("Unifom has invalid matrix stride");
	}

	out_uniform_details.m_array_stride = array_stride;
}